

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplaceRealloc<std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *this,pointer pos,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  char *pcVar3;
  undefined8 uVar4;
  pointer pbVar5;
  size_t *psVar6;
  size_t *psVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar10 = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (uVar10 < uVar2 * 2) {
    uVar10 = uVar2 * 2;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    uVar10 = 0x7ffffffffffffff;
  }
  lVar11 = (long)pos - *(long *)this;
  psVar7 = (size_t *)operator_new(uVar10 << 4);
  pcVar3 = args->_M_str;
  *(size_t *)((long)psVar7 + lVar11) = args->_M_len;
  ((size_t *)((long)psVar7 + lVar11))[1] = (size_t)pcVar3;
  p = *(pointer *)this;
  lVar8 = *(long *)(this + 8) * 0x10;
  lVar9 = (long)p + (lVar8 - (long)pos);
  pbVar5 = p;
  psVar6 = psVar7;
  if (lVar9 == 0) {
    if (*(long *)(this + 8) != 0) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->_M_len + lVar9);
        uVar4 = puVar1[1];
        *(undefined8 *)((long)psVar7 + lVar9) = *puVar1;
        ((undefined8 *)((long)psVar7 + lVar9))[1] = uVar4;
        lVar9 = lVar9 + 0x10;
      } while (lVar8 != lVar9);
    }
  }
  else {
    for (; pbVar5 != pos; pbVar5 = pbVar5 + 1) {
      pcVar3 = pbVar5->_M_str;
      *psVar6 = pbVar5->_M_len;
      psVar6[1] = (size_t)pcVar3;
      psVar6 = psVar6 + 2;
    }
    memcpy((void *)((long)psVar7 + lVar11 + 0x10),pos,(lVar9 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar10;
  *(size_t **)this = psVar7;
  return (pointer)((long)psVar7 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}